

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O2

size_t cobs_decode(uint8_t *input,size_t length,uint8_t *output)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  
  uVar4 = 0;
  sVar2 = 0;
  while( true ) {
    sVar6 = sVar2;
    uVar3 = uVar4;
    if (length <= uVar3) {
      return sVar6;
    }
    bVar1 = input[uVar3];
    if ((ulong)bVar1 != 1 && length < uVar3 + bVar1) break;
    for (lVar5 = 0; (byte)((char)lVar5 + 1U) < bVar1; lVar5 = lVar5 + 1) {
      output[lVar5 + sVar6] = input[lVar5 + uVar3 + 1];
    }
    uVar4 = uVar3 + lVar5 + 1;
    sVar2 = sVar6 + lVar5;
    if ((bVar1 != 0xff) && ((length - 1) - uVar3 != lVar5)) {
      output[sVar6 + lVar5] = '\0';
      sVar2 = sVar6 + lVar5 + 1;
    }
  }
  return 0;
}

Assistant:

size_t cobs_decode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 0;
  uint8_t code;


  while(read_index < length)
  {
    code = input[read_index];

    if(read_index + code > length && code != 1)
    {
      return 0;
    }

    read_index++;

    for(uint8_t i = 1; i < code; i++)
    {
      output[write_index++] = input[read_index++];
    }

    if(code != 0xFF && read_index != length)
    {
      output[write_index++] = '\0';
    }
  }

  return write_index;
}